

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O2

bool wallet::feebumper::SignTransaction(CWallet *wallet,CMutableTransaction *mtx)

{
  long lVar1;
  bool bVar2;
  optional<common::PSBTError> oVar3;
  long in_FS_OFFSET;
  bool complete;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock3;
  PartiallySignedTransaction psbtx;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock3,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/feebumper.cpp"
             ,0x151,false);
  bVar2 = CWallet::IsWalletFlagSet(wallet,0x800000000);
  if (bVar2) {
    PartiallySignedTransaction::PartiallySignedTransaction(&psbtx,mtx);
    CWallet::FillPSBT(wallet,&psbtx,&complete,1,false,true,(size_t *)0x0,true);
    oVar3 = CWallet::FillPSBT(wallet,&psbtx,&complete,1,true,false,(size_t *)0x0,true);
    if (((ulong)oVar3.super__Optional_base<common::PSBTError,_true,_true>._M_payload.
                super__Optional_payload_base<common::PSBTError> >> 0x20 & 1) == 0) {
      bVar2 = FinalizeAndExtractPSBT(&psbtx,mtx);
    }
    else {
      bVar2 = false;
    }
    PartiallySignedTransaction::~PartiallySignedTransaction(&psbtx);
  }
  else {
    bVar2 = CWallet::SignTransaction(wallet,mtx);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock3.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool SignTransaction(CWallet& wallet, CMutableTransaction& mtx) {
    LOCK(wallet.cs_wallet);

    if (wallet.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
        // Make a blank psbt
        PartiallySignedTransaction psbtx(mtx);

        // First fill transaction with our data without signing,
        // so external signers are not asked to sign more than once.
        bool complete;
        wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, false /* sign */, true /* bip32derivs */);
        auto err{wallet.FillPSBT(psbtx, complete, SIGHASH_ALL, true /* sign */, false  /* bip32derivs */)};
        if (err) return false;
        complete = FinalizeAndExtractPSBT(psbtx, mtx);
        return complete;
    } else {
        return wallet.SignTransaction(mtx);
    }
}